

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSocket.cpp
# Opt level: O3

void __thiscall hwnet::TCPSocket::TCPSocket(TCPSocket *this,Poller *poller_,int fd)

{
  rep rVar1;
  
  (this->super_enable_shared_from_this<hwnet::TCPSocket>)._M_weak_this.
  super___weak_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_enable_shared_from_this<hwnet::TCPSocket>)._M_weak_this.
  super___weak_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_Task)._vptr_Task = (_func_int **)&PTR_Do_00123940;
  (this->super_Channel)._vptr_Channel = (_func_int **)&PTR_OnActive_00123978;
  (this->recvList).
  super__List_base<std::shared_ptr<hwnet::Buffer>,_std::allocator<std::shared_ptr<hwnet::Buffer>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->recvList;
  (this->recvList).
  super__List_base<std::shared_ptr<hwnet::Buffer>,_std::allocator<std::shared_ptr<hwnet::Buffer>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->recvList;
  (this->recvList).
  super__List_base<std::shared_ptr<hwnet::Buffer>,_std::allocator<std::shared_ptr<hwnet::Buffer>_>_>
  ._M_impl._M_node._M_size = 0;
  this->sendLists[0].head = (sendContext *)0x0;
  this->sendLists[0].tail = (sendContext *)0x0;
  this->sendLists[1].head = (sendContext *)0x0;
  this->sendLists[1].tail = (sendContext *)0x0;
  this->fd = fd;
  this->readableVer = 0;
  this->writeable = false;
  memset(&this->err,0,0xa5);
  this->writeableVer = 0;
  this->closed = (__atomic_base<bool>)0x0;
  this->closedOnFlush = false;
  this->shutdown = false;
  this->doing = false;
  this->socketError = false;
  this->poller_ = poller_;
  (this->remoteAddr).addrType = 0;
  (this->remoteAddr).family = 0;
  (this->mtx).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->mtx).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->mtx).super___mutex_base._M_mutex + 0x10) = 0;
  (this->mtx).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->mtx).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  this->bytes4Send = 0;
  this->highWaterSize = 0;
  (this->localAddr).addrType = 0;
  (this->localAddr).family = 0;
  this->pool_ = (ThreadPool *)0x0;
  (this->ud).content = (placeholder *)0x0;
  (this->ud).counter = (int *)0x0;
  (this->started)._M_base._M_i = false;
  (this->closures).
  super__List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl._M_node
  .super__List_node_base._M_prev = (_List_node_base *)&this->closures;
  (this->closures).
  super__List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl._M_node
  .super__List_node_base._M_next = (_List_node_base *)&this->closures;
  (this->closures).
  super__List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl._M_node
  ._M_size = 0;
  (this->timer).super___weak_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->timer).super___weak_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->recvTimeout = 0;
  *(undefined8 *)&(this->recvTimeoutCallback_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->recvTimeoutCallback_).super__Function_base._M_functor + 8) = 0;
  (this->recvTimeoutCallback_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->recvTimeoutCallback_)._M_invoker = (_Invoker_type)0x0;
  rVar1 = std::chrono::_V2::steady_clock::now();
  (this->lastRecvTime).__d.__r = rVar1;
  this->sendTimeout = 0;
  *(undefined8 *)&(this->sendTimeoutCallback_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->sendTimeoutCallback_).super__Function_base._M_functor + 8) = 0;
  (this->sendTimeoutCallback_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->sendTimeoutCallback_)._M_invoker = (_Invoker_type)0x0;
  rVar1 = std::chrono::_V2::steady_clock::now();
  (this->lastSendTime).__d.__r = rVar1;
  this->slistIdx = 0;
  this->ptrSendlist = this->sendLists;
  return;
}

Assistant:

TCPSocket::TCPSocket(Poller *poller_,int fd):fd(fd),err(0),flushCallback_(nullptr),
	errorCallback_(nullptr),closeCallback_(nullptr),readable(false),readableVer(0),writeable(false),
	writeableVer(0),closed(false),closedOnFlush(false),shutdown(false),doing(false),socketError(false),poller_(poller_),
	bytes4Send(0),highWaterSize(0),pool_(nullptr),started(false),
	recvTimeout(0),recvTimeoutCallback_(nullptr),lastRecvTime(std::chrono::steady_clock::now()),
	sendTimeout(0),sendTimeoutCallback_(nullptr),lastSendTime(std::chrono::steady_clock::now()) {
		slistIdx = 0;
		ptrSendlist = &sendLists[slistIdx];

#ifdef GATHER_RECV
		rlistIdx = 0;
		ptrRecvlist = &recvLists[rlistIdx];		
#endif

#ifdef USE_SSL
		this->ssl = nullptr;
#endif

	}